

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel(MultiAgentDecisionProcessDiscrete *this)

{
  void *pvVar1;
  TransitionModelMappingSparse *this_00;
  long *in_RDI;
  undefined8 in_stack_ffffffffffffffc8;
  TransitionModelMapping *in_stack_ffffffffffffffd0;
  
  if (((*(byte *)(in_RDI + 0x3c) & 1) != 0) && ((long *)in_RDI[0x3d] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[0x3d] + 8))();
  }
  if ((*(byte *)((long)in_RDI + 0x1e1) & 1) == 0) {
    pvVar1 = operator_new(0x28);
    (**(code **)(*in_RDI + 0x30))();
    (**(code **)(*in_RDI + 0x70))();
    TransitionModelMapping::TransitionModelMapping
              (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               (int)in_stack_ffffffffffffffc8);
    in_RDI[0x3d] = (long)pvVar1;
  }
  else {
    pvVar1 = operator_new(0x28);
    this_00 = (TransitionModelMappingSparse *)(**(code **)(*in_RDI + 0x30))();
    (**(code **)(*in_RDI + 0x70))();
    TransitionModelMappingSparse::TransitionModelMappingSparse
              (this_00,(int)((ulong)pvVar1 >> 0x20),(int)pvVar1);
    in_RDI[0x3d] = (long)pvVar1;
  }
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel()
{
    if(_m_initialized)
        delete(_m_p_tModel);

    if(_m_sparse)
        _m_p_tModel=new TransitionModelMappingSparse(GetNrStates(),
                                                     GetNrJointActions());
    else
        _m_p_tModel=new TransitionModelMapping(GetNrStates(),
                                               GetNrJointActions());

}